

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  string *psVar1;
  string *psVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pcVar5;
  bool is_soo_local;
  LogMessageFatal local_20 [16];
  
  local_20[0] = (LogMessageFatal)
                ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0);
  is_soo_local = is_soo;
  psVar1 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                     (&is_soo_local,(bool *)local_20,"is_soo == this->is_soo()");
  if (psVar1 != (string *)0x0) {
    pcVar5 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    uVar4 = 0xd0;
LAB_001b157d:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,uVar4,sVar3,pcVar5);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
  }
  if (is_soo_local == false) {
    (this->field_0).long_rep.size = size;
  }
  else {
    if (3 < size) {
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)(uint)size,3,"size <= kSooSizeMask");
      pcVar5 = *(pointer *)psVar2;
      sVar3 = *(size_type *)(psVar2 + 8);
      uVar4 = 0xd2;
      goto LAB_001b157d;
    }
    (this->field_0).long_rep.elements_int =
         (long)size | (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }